

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialogPrivate::showHeader(QFileDialogPrivate *this,QAction *action)

{
  long lVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  QHeaderView *this_00;
  long lVar5;
  long lVar6;
  int logicalIndex;
  long in_FS_OFFSET;
  QArrayData *local_40;
  long local_38;
  long local_30;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::sender();
  QMetaObject::cast((QObject *)&QActionGroup::staticMetaObject);
  this_00 = QTreeView::header(&((this->qFileDialogUi).d)->treeView->super_QTreeView);
  QActionGroup::actions();
  if (local_30 == 0) {
    logicalIndex = 0;
  }
  else {
    lVar5 = local_30 << 3;
    logicalIndex = 0;
    lVar6 = 0;
    do {
      if (lVar5 == 0) goto LAB_004ea0c2;
      lVar1 = lVar6 + 1;
      lVar5 = lVar5 + -8;
      lVar2 = lVar6 * 8;
      lVar6 = lVar1;
    } while (*(QAction **)(local_38 + lVar2) != action);
    logicalIndex = (int)lVar1;
  }
LAB_004ea0c2:
  bVar4 = QAction::isChecked();
  QHeaderView::setSectionHidden(this_00,logicalIndex,(bool)(bVar4 ^ 1));
  if (local_40 != (QArrayData *)0x0) {
    LOCK();
    (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::showHeader(QAction *action)
{
    Q_Q(QFileDialog);
    QActionGroup *actionGroup = qobject_cast<QActionGroup*>(q->sender());
    qFileDialogUi->treeView->header()->setSectionHidden(int(actionGroup->actions().indexOf(action) + 1),
                                                        !action->isChecked());
}